

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Sys.cpp
# Opt level: O2

Url * __thiscall Vault::Sys::getUrl(Url *__return_storage_ptr__,Sys *this,Path *path)

{
  Client *pCVar1;
  allocator<char> local_41;
  string local_40 [32];
  
  pCVar1 = this->client_;
  std::__cxx11::string::string<std::allocator<char>>(local_40,"/v1/sys/",&local_41);
  (*pCVar1->_vptr_Client[3])(__return_storage_ptr__,pCVar1,local_40,path);
  std::__cxx11::string::~string(local_40);
  return __return_storage_ptr__;
}

Assistant:

Vault::Url Vault::Sys::getUrl(const Path &path) {
  return client_.getUrl("/v1/sys/", path);
}